

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcSizeContents(ImGuiWindow *window)

{
  float fVar1;
  ImVec2 IVar2;
  float fVar3;
  
  if ((window->Collapsed != true) &&
     (((window->Hidden != true || (window->HiddenFramesForResize != 0)) ||
      (window->HiddenFramesRegular < 1)))) {
    fVar1 = (window->SizeContentsExplicit).x;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      fVar1 = ((window->DC).CursorMaxPos.x - (window->Pos).x) + (window->Scroll).x;
    }
    fVar3 = (window->SizeContentsExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = ((window->DC).CursorMaxPos.y - (window->Pos).y) + (window->Scroll).y;
    }
    IVar2.x = (float)(int)fVar1 + (window->WindowPadding).x;
    IVar2.y = (float)(int)fVar3 + (window->WindowPadding).y;
    return IVar2;
  }
  return window->SizeContents;
}

Assistant:

static ImVec2 CalcSizeContents(ImGuiWindow* window)
{
    if (window->Collapsed)
        return window->SizeContents;
    if (window->Hidden && window->HiddenFramesForResize == 0 && window->HiddenFramesRegular > 0)
        return window->SizeContents;

    ImVec2 sz;
    sz.x = (float)(int)((window->SizeContentsExplicit.x != 0.0f) ? window->SizeContentsExplicit.x : (window->DC.CursorMaxPos.x - window->Pos.x + window->Scroll.x));
    sz.y = (float)(int)((window->SizeContentsExplicit.y != 0.0f) ? window->SizeContentsExplicit.y : (window->DC.CursorMaxPos.y - window->Pos.y + window->Scroll.y));
    return sz + window->WindowPadding;
}